

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O2

void cuddCacheInsert1(DdManager *table,DD_CTFP1 op,DdNode *f,DdNode *data)

{
  DdCache *pDVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = ((int)op * 0xc00005 +
          (((uint)f & 1) + *(int *)(((ulong)f & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00006) *
          0x40f1f9;
  uVar3 = uVar2 >> ((byte)table->cacheShift & 0x1f);
  pDVar1 = table->cache + (int)uVar3;
  if (table->cache[(int)uVar3].data != (DdNode *)0x0) {
    table->cachecollisions = table->cachecollisions + 1.0;
  }
  table->cacheinserts = table->cacheinserts + 1.0;
  pDVar1->f = f;
  pDVar1->g = f;
  pDVar1->h = (ptruint)op;
  pDVar1->data = data;
  pDVar1->hash = uVar2;
  return;
}

Assistant:

void
cuddCacheInsert1(
  DdManager * table,
  DD_CTFP1 op,
  DdNode * f,
  DdNode * data)
{
    int posn;
    unsigned hash;
    register DdCache *entry;

    hash = ddCHash2_(op,cuddF2L(f),cuddF2L(f));
//    posn = ddCHash2(op,cuddF2L(f),cuddF2L(f),table->cacheShift);
    posn = hash >> table->cacheShift;
    entry = &table->cache[posn];

    if (entry->data != NULL) {
        table->cachecollisions++;
    }
    table->cacheinserts++;

    entry->f = f;
    entry->g = f;
    entry->h = (ptruint) op;
    entry->data = data;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif
    entry->hash = hash;

}